

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

double __thiscall IF97::Region3Backwards::OPline::T_p(OPline *this,double p)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar6 = log(p);
  sVar2 = (this->super_Region3RegionDivision).N;
  if (sVar2 == 0) {
    dVar7 = 0.0;
  }
  else {
    dVar7 = 0.0;
    sVar5 = 0;
    do {
      uVar1 = (this->super_Region3RegionDivision).I.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar5];
      dVar8 = 1.0;
      if (uVar1 != 0) {
        uVar4 = -uVar1;
        if (0 < (int)uVar1) {
          uVar4 = uVar1;
        }
        dVar9 = 1.0 / dVar6;
        if (-1 < (int)uVar1) {
          dVar9 = dVar6;
        }
        dVar8 = 1.0;
        do {
          if ((uVar4 & 1) != 0) {
            dVar8 = dVar8 * dVar9;
          }
          dVar9 = dVar9 * dVar9;
          bVar3 = 1 < uVar4;
          uVar4 = uVar4 >> 1;
        } while (bVar3);
      }
      dVar7 = dVar7 + dVar8 * (this->super_Region3RegionDivision).n.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar5 != sVar2);
  }
  return dVar7;
}

Assistant:

virtual double T_p(double p){
                const double pi = p/(1.0*p_fact), ln_pi = log(pi);
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*powi(ln_pi, I[i]);
                }
                return summer*1.0;  // sum is multiplied by T* = 1.0 [K]
            }